

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_test_util.cc
# Opt level: O2

string * ctemplate::StringToTemplateFile(string *__return_storage_ptr__,string *s)

{
  char *pcVar1;
  allocator local_8a;
  allocator local_89;
  char buf [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30 [32];
  
  StringToTemplateFile::filenum = StringToTemplateFile::filenum + 1;
  snprintf(buf,0x10,"%03d");
  pcVar1 = "";
  if (g_tmpdir != (char *)0x0) {
    pcVar1 = g_tmpdir;
  }
  std::__cxx11::string::string(local_30,pcVar1,&local_89);
  std::__cxx11::string::string((string *)&local_70,"template.",&local_8a);
  std::operator+(&local_50,&local_70,buf);
  ctemplate::PathJoin((string *)__return_storage_ptr__,local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string(local_30);
  StringToFile(s,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string StringToTemplateFile(const string& s) {
  static int filenum = 0;
  char buf[16];
  snprintf(buf, sizeof(buf), "%03d", ++filenum);
  string filename = PathJoin(g_tmpdir ? g_tmpdir : "",
                             string("template.") + buf);
  StringToFile(s, filename);
  return filename;
}